

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_rc_Ptr.h
# Opt level: O2

void __thiscall axl::rc::Ptr<void>::clear(Ptr<void> *this)

{
  if (this->m_refCount != (RefCount *)0x0) {
    RefCount::release(this->m_refCount);
  }
  this->m_p = (void *)0x0;
  this->m_refCount = (RefCount *)0x0;
  return;
}

Assistant:

void
	clear() {
		if (m_refCount)
			m_refCount->release();

		initialize();
	}